

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::SelectCoinsBnB
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount *selection_target,CAmount *cost_of_change,int max_selection_weight)

{
  _Rb_tree_header *p_Var1;
  pointer pOVar2;
  long lVar3;
  long lVar4;
  unsigned_long uVar5;
  pointer puVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  _Rb_tree_color _Var9;
  long lVar10;
  optional<long> *poVar11;
  undefined8 uVar12;
  pointer pOVar13;
  ulong uVar14;
  pointer pOVar15;
  _Rb_tree_node_base *p_Var16;
  ulong uVar17;
  ulong uVar18;
  _Rb_tree_node_base *p_Var19;
  long lVar20;
  pointer puVar21;
  long lVar22;
  size_t *psVar23;
  long lVar24;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  long lVar25;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  SelectionResult result;
  int local_22c;
  long local_220;
  unsigned_long local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  ulong *local_1b8;
  iterator iStack_1b0;
  unsigned_long *local_1a8;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_198 [8];
  _Rb_tree_node_base local_190;
  size_t local_170;
  long local_168;
  undefined8 uStack_160;
  _Storage<long,_true> local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  size_t sStack_140;
  undefined8 local_138;
  CAmount CStack_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  SelectionResult local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_target = *selection_target;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_algo = BNB;
  local_a8.m_use_effective = false;
  local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_a8.m_algo_completed = true;
  local_a8.m_weight = 0;
  local_a8.bump_fee_group_discount = 0;
  local_1a8 = (unsigned_long *)0x0;
  local_1b8 = (ulong *)0x0;
  iStack_1b0._M_current = (ulong *)0x0;
  pOVar15 = (utxo_pool->
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar2 = (utxo_pool->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pOVar15 == pOVar2) {
    if (local_a8.m_target < 1) {
      lVar20 = 0;
      goto LAB_00556651;
    }
LAB_005565d3:
    local_e8 = &local_d8;
    uStack_b0 = 0;
    uStack_d0 = 0;
    local_c8 = &local_b8;
    *(undefined1 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
    local_e0 = 0;
    local_d8 = 0;
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0';
  }
  else {
    lVar20 = 0;
    pOVar13 = pOVar15;
    do {
      lVar3 = *(long *)((long)&pOVar13->m_value +
                       (ulong)((pOVar13->m_subtract_fee_outputs ^ 1) << 5));
      if (lVar3 < 1) {
LAB_00556cdb:
        __assert_fail("utxo.GetSelectionAmount() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0x6a,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      lVar20 = lVar20 + lVar3;
      pOVar13 = pOVar13 + 1;
    } while (pOVar13 != pOVar2);
    if (lVar20 < local_a8.m_target) goto LAB_005565d3;
    if (pOVar15 != pOVar2) {
      uVar14 = ((long)pOVar2 - (long)pOVar15 >> 3) * 0x4ec4ec4ec4ec4ec5;
      lVar3 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                (pOVar15,pOVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pOVar2 - (long)pOVar15 < 0x681) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (pOVar15);
      }
      else {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (pOVar15);
        for (pOVar15 = pOVar15 + 0x10; pOVar15 != pOVar2; pOVar15 = pOVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                    (pOVar15);
        }
      }
    }
LAB_00556651:
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (ulong *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (ulong *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pOVar15 = (utxo_pool->
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl
              .super__Vector_impl_data._M_start;
    if ((utxo_pool->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
        _M_impl.super__Vector_impl_data._M_finish == pOVar15) {
LAB_00556d63:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00556d8c:
        __assert_fail("best_waste == result.GetWaste()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0xc6,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      goto LAB_00556e66;
    }
    lVar3 = pOVar15->fee;
    lVar4 = pOVar15->long_term_fee;
    local_1e0 = 0;
    local_220 = 2100000000000000;
    lVar22 = 0;
    local_22c = 0;
    lVar24 = 0;
    bVar8 = false;
    lVar25 = 0;
    do {
      uVar5 = local_1e0;
      lVar10 = *selection_target;
      if (((lVar20 + lVar22 < lVar10) || (*cost_of_change + lVar10 < lVar22)) ||
         (local_220 < lVar25 && lVar4 < lVar3)) {
LAB_005566de:
        if (local_1b8 == iStack_1b0._M_current) break;
        uVar14 = local_1e0 - 1;
        uVar18 = iStack_1b0._M_current[-1];
        if (uVar18 < uVar14) {
          pOVar15 = (utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar17 = ((long)(utxo_pool->
                          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          pOVar15 = pOVar15 + local_1e0;
          do {
            if (uVar17 < uVar14 || uVar17 - uVar14 == 0) {
              local_1e0 = uVar14;
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00556e66;
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              goto LAB_00556cdb;
            }
            lVar20 = lVar20 + *(long *)(((ulong)((pOVar15[-1].m_subtract_fee_outputs ^ 1) << 5) -
                                        0x48) + (long)pOVar15);
            uVar14 = uVar14 - 1;
            uVar18 = iStack_1b0._M_current[-1];
            pOVar15 = pOVar15 + -1;
          } while (uVar18 < uVar14);
        }
        local_1e0 = uVar14;
        if (local_1e0 != uVar18) goto LAB_00556d1f;
        pOVar15 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar14 = ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        if (uVar14 < local_1e0 || uVar14 - local_1e0 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00556e66;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00556d63;
        }
        lVar22 = lVar22 - *(long *)((long)&pOVar15[local_1e0].m_value +
                                   (ulong)((pOVar15[local_1e0].m_subtract_fee_outputs ^ 1) << 5));
        lVar25 = (lVar25 - pOVar15[local_1e0].fee) + pOVar15[local_1e0].long_term_fee;
        local_22c = local_22c - pOVar15[local_1e0].m_weight;
        iStack_1b0._M_current = iStack_1b0._M_current + -1;
      }
      else {
        if (max_selection_weight < local_22c) {
          bVar8 = true;
          goto LAB_005566de;
        }
        if (lVar10 <= lVar22) {
          lVar25 = (lVar22 - lVar10) + lVar25;
          if (lVar25 <= local_220) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&local_1d8,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
            lVar10 = *selection_target;
            local_220 = lVar25;
          }
          lVar25 = (lVar25 - lVar22) + lVar10;
          goto LAB_005566de;
        }
        pOVar15 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar18 = ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        uVar14 = local_1e0;
        if (uVar18 < local_1e0 || uVar18 - local_1e0 == 0) {
LAB_00556dae:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar12 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar14);
            if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (ulong *)0x0) {
              operator_delete(local_1d8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1d8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1d8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_1b8 != (ulong *)0x0) {
              operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
            }
            _GLOBAL__N_1::std::
            _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                         *)&local_a8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar12);
            }
          }
          goto LAB_00556e66;
        }
        uVar17 = (ulong)((pOVar15[local_1e0].m_subtract_fee_outputs ^ 1) << 5);
        lVar10 = *(long *)((long)&pOVar15[local_1e0].m_value + uVar17);
        lVar20 = lVar20 - lVar10;
        if ((local_1b8 == iStack_1b0._M_current) ||
           (uVar14 = local_1e0 - 1, uVar14 == iStack_1b0._M_current[-1])) {
LAB_005568ce:
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1b8,iStack_1b0,
                       &local_1e0);
            uVar17 = (ulong)(((byte)~pOVar15[uVar5].m_subtract_fee_outputs & 1) << 5);
          }
          else {
            *iStack_1b0._M_current = local_1e0;
            iStack_1b0._M_current = iStack_1b0._M_current + 1;
          }
          lVar22 = lVar22 + *(long *)((long)&pOVar15[uVar5].m_value + uVar17);
          lVar25 = (lVar25 + pOVar15[uVar5].fee) - pOVar15[uVar5].long_term_fee;
          local_22c = local_22c + pOVar15[uVar5].m_weight;
        }
        else {
          if (uVar18 < uVar14 || uVar18 - uVar14 == 0) goto LAB_00556dae;
          if ((lVar10 != *(long *)((long)&pOVar15[uVar14].m_value +
                                  (ulong)((pOVar15[uVar14].m_subtract_fee_outputs ^ 1) << 5))) ||
             (pOVar15[local_1e0].fee != pOVar15[uVar14].fee)) goto LAB_005568ce;
        }
      }
      lVar24 = lVar24 + 1;
      local_1e0 = local_1e0 + 1;
    } while (lVar24 != 100000);
    puVar6 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar8) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_128 = &local_118;
        uStack_f0 = 0;
        uStack_110 = 0;
        local_108 = &local_f8;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        local_120 = 0;
        local_118 = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        uStack_100 = 0;
        local_f8 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
      }
    }
    else {
      puVar21 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar14 = *puVar21;
        pOVar15 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar18 = ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        if (uVar18 < uVar14 || uVar18 - uVar14 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00556d1f:
            __assert_fail("utxo_pool_index == curr_selection.back()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                          ,0x9f,
                          "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                         );
          }
          goto LAB_00556e66;
        }
        pOVar15 = pOVar15 + uVar14;
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&local_a8,&pOVar15->m_outputs);
        local_a8.m_use_effective = (bool)(pOVar15->m_subtract_fee_outputs ^ 1);
        local_a8.m_weight = local_a8.m_weight + pOVar15->m_weight;
        puVar21 = puVar21 + 1;
      } while (puVar21 != puVar6);
      SelectionResult::RecalculateWaste(&local_a8,*cost_of_change,*cost_of_change,0);
      poVar11 = inline_assertion_check<true,std::optional<long>const&>
                          (&local_a8.m_waste,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                           ,0x36e,"GetWaste","m_waste");
      p_Var7 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      psVar23 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (local_220 !=
          (poVar11->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value) goto LAB_00556d8c;
      if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
        psVar23 = &local_170;
        local_190._M_parent = (_Base_ptr)0x0;
        local_190._M_color = _S_red;
        local_190._M_left = &local_190;
        local_190._M_right = &local_190;
      }
      else {
        local_190._M_parent =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
        _M_parent = &local_190;
        local_170 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        p_Var1 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
        local_190._M_left =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_190._M_right =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        local_190._M_color =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
      }
      *psVar23 = 0;
      uStack_160 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
      uStack_150 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._9_7_,
                            local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      local_148 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
      local_138 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
      local_168 = local_a8.m_target;
      local_158 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload;
      sStack_140 = local_a8.m_selections_evaluated;
      CStack_130 = local_a8.bump_fee_group_discount;
      p_Var16 = (_Rb_tree_node_base *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
      if (p_Var7 == (_Base_ptr)0x0) {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        psVar23 = (size_t *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                  0x28);
        _Var9 = _S_red;
        p_Var19 = p_Var16;
      }
      else {
        psVar23 = &local_170;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
             p_Var7;
        p_Var7->_M_parent = p_Var16;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
             local_170;
        local_190._M_parent = (_Base_ptr)0x0;
        p_Var16 = local_190._M_left;
        p_Var19 = local_190._M_right;
        _Var9 = local_190._M_color;
        local_190._M_left = &local_190;
        local_190._M_right = &local_190;
      }
      *(_Rb_tree_node_base **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
           p_Var16;
      *(_Rb_tree_node_base **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           p_Var19;
      *psVar23 = 0;
      *(_Rb_tree_color *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var9;
      *(long *)((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30)
           = local_168;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
           uStack_160;
      *(_Storage<long,_true> *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
           local_158;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
           uStack_150;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
           local_148;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
           sStack_140;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
           local_138;
      *(CAmount *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
           CStack_130;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01'
      ;
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree(local_198);
    }
    if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8 != (ulong *)0x0) {
      operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
    }
  }
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00556e66:
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoinsBnB(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, const CAmount& cost_of_change,
                                             int max_selection_weight)
{
    SelectionResult result(selection_target, SelectionAlgorithm::BNB);
    CAmount curr_value = 0;
    std::vector<size_t> curr_selection; // selected utxo indexes
    int curr_selection_weight = 0; // sum of selected utxo weight

    // Calculate curr_available_value
    CAmount curr_available_value = 0;
    for (const OutputGroup& utxo : utxo_pool) {
        // Assert that this utxo is not negative. It should never be negative,
        // effective value calculation should have removed it
        assert(utxo.GetSelectionAmount() > 0);
        curr_available_value += utxo.GetSelectionAmount();
    }
    if (curr_available_value < selection_target) {
        return util::Error();
    }

    // Sort the utxo_pool
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending);

    CAmount curr_waste = 0;
    std::vector<size_t> best_selection;
    CAmount best_waste = MAX_MONEY;

    bool is_feerate_high = utxo_pool.at(0).fee > utxo_pool.at(0).long_term_fee;
    bool max_tx_weight_exceeded = false;

    // Depth First search loop for choosing the UTXOs
    for (size_t curr_try = 0, utxo_pool_index = 0; curr_try < TOTAL_TRIES; ++curr_try, ++utxo_pool_index) {
        // Conditions for starting a backtrack
        bool backtrack = false;
        if (curr_value + curr_available_value < selection_target || // Cannot possibly reach target with the amount remaining in the curr_available_value.
            curr_value > selection_target + cost_of_change || // Selected value is out of range, go back and try other branch
            (curr_waste > best_waste && is_feerate_high)) { // Don't select things which we know will be more wasteful if the waste is increasing
            backtrack = true;
        } else if (curr_selection_weight > max_selection_weight) { // Selected UTXOs weight exceeds the maximum weight allowed, cannot find more solutions by adding more inputs
            max_tx_weight_exceeded = true; // at least one selection attempt exceeded the max weight
            backtrack = true;
        } else if (curr_value >= selection_target) {       // Selected value is within range
            curr_waste += (curr_value - selection_target); // This is the excess value which is added to the waste for the below comparison
            // Adding another UTXO after this check could bring the waste down if the long term fee is higher than the current fee.
            // However we are not going to explore that because this optimization for the waste is only done when we have hit our target
            // value. Adding any more UTXOs will be just burning the UTXO; it will go entirely to fees. Thus we aren't going to
            // explore any more UTXOs to avoid burning money like that.
            if (curr_waste <= best_waste) {
                best_selection = curr_selection;
                best_waste = curr_waste;
            }
            curr_waste -= (curr_value - selection_target); // Remove the excess value as we will be selecting different coins now
            backtrack = true;
        }

        if (backtrack) { // Backtracking, moving backwards
            if (curr_selection.empty()) { // We have walked back to the first utxo and no branch is untraversed. All solutions searched
                break;
            }

            // Add omitted UTXOs back to lookahead before traversing the omission branch of last included UTXO.
            for (--utxo_pool_index; utxo_pool_index > curr_selection.back(); --utxo_pool_index) {
                curr_available_value += utxo_pool.at(utxo_pool_index).GetSelectionAmount();
            }

            // Output was included on previous iterations, try excluding now.
            assert(utxo_pool_index == curr_selection.back());
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);
            curr_value -= utxo.GetSelectionAmount();
            curr_waste -= utxo.fee - utxo.long_term_fee;
            curr_selection_weight -= utxo.m_weight;
            curr_selection.pop_back();
        } else { // Moving forwards, continuing down this branch
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);

            // Remove this utxo from the curr_available_value utxo amount
            curr_available_value -= utxo.GetSelectionAmount();

            if (curr_selection.empty() ||
                // The previous index is included and therefore not relevant for exclusion shortcut
                (utxo_pool_index - 1) == curr_selection.back() ||
                // Avoid searching a branch if the previous UTXO has the same value and same waste and was excluded.
                // Since the ratio of fee to long term fee is the same, we only need to check if one of those values match in order to know that the waste is the same.
                utxo.GetSelectionAmount() != utxo_pool.at(utxo_pool_index - 1).GetSelectionAmount() ||
                utxo.fee != utxo_pool.at(utxo_pool_index - 1).fee)
            {
                // Inclusion branch first (Largest First Exploration)
                curr_selection.push_back(utxo_pool_index);
                curr_value += utxo.GetSelectionAmount();
                curr_waste += utxo.fee - utxo.long_term_fee;
                curr_selection_weight += utxo.m_weight;
            }
        }
    }

    // Check for solution
    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    // Set output set
    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool.at(i));
    }
    result.RecalculateWaste(cost_of_change, cost_of_change, CAmount{0});
    assert(best_waste == result.GetWaste());

    return result;
}